

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O0

int __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::subtree_ref::copy
          (subtree_ref *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  bool bVar1;
  size_t sVar2;
  leaf_reference __src;
  leaf_reference __dest;
  bt_impl<4096UL,_(bv::allocation_policy_t)0> *this_00;
  range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  *in_stack_ffffffffffffff68;
  range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  *in_stack_ffffffffffffff70;
  
  this_00 = (bt_impl<4096UL,_(bv::allocation_policy_t)0> *)this;
  memcpy(this,dst,0x28);
  bVar1 = subtree_ref_base<false>::is_node((subtree_ref_base<false> *)dst);
  if (bVar1) {
    sVar2 = alloc_node(this_00);
    this_00->node_width = sVar2;
    subtree_ref_base<false>::sizes((subtree_ref_base<false> *)dst);
    subtree_ref_base<false>::sizes((subtree_ref_base<false> *)dst);
    range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
    ::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    subtree_ref_base<false>::ranks((subtree_ref_base<false> *)dst);
    subtree_ref_base<false>::ranks((subtree_ref_base<false> *)dst);
    range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
    ::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    subtree_ref_base<false>::pointers((subtree_ref_base<false> *)dst);
    subtree_ref_base<false>::pointers((subtree_ref_base<false> *)dst);
    range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
    ::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else {
    sVar2 = alloc_leaf(this_00);
    this_00->node_width = sVar2;
    __src = subtree_ref_base<false>::leaf((subtree_ref_base<false> *)0x13a397);
    __dest = subtree_ref_base<false>::leaf((subtree_ref_base<false> *)0x13a3a5);
    memcpy(__dest,__src,0x200);
  }
  return (int)this;
}

Assistant:

subtree_ref copy() const
            {
                subtree_ref r = *this;
                if(is_node()) {
                    r._index = _vector.alloc_node();
                    
                    r.sizes()  = sizes();
                    r.ranks()    = ranks();
                    r.pointers() = pointers();
                } else {
                    r._index = _vector.alloc_leaf();
                    r.leaf() = leaf();
                }
                
                return r;
            }